

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void google::protobuf::DynamicMessageFactory::DeleteDefaultOneofInstance
               (Descriptor *type,uint32 *offsets,void *default_oneof_instance)

{
  int iVar1;
  CppType CVar2;
  OneofDescriptor *pOVar3;
  FieldDescriptor *this;
  FieldOptions *this_00;
  FieldDescriptor *field;
  int j;
  int i;
  void *default_oneof_instance_local;
  uint32 *offsets_local;
  Descriptor *type_local;
  
  for (field._4_4_ = 0; iVar1 = Descriptor::oneof_decl_count(type), field._4_4_ < iVar1;
      field._4_4_ = field._4_4_ + 1) {
    field._0_4_ = 0;
    while( true ) {
      pOVar3 = Descriptor::oneof_decl(type,field._4_4_);
      iVar1 = OneofDescriptor::field_count(pOVar3);
      if (iVar1 <= (int)field) break;
      pOVar3 = Descriptor::oneof_decl(type,field._4_4_);
      this = OneofDescriptor::field(pOVar3,(int)field);
      CVar2 = FieldDescriptor::cpp_type(this);
      if (CVar2 == CPPTYPE_STRING) {
        this_00 = FieldDescriptor::options(this);
        FieldOptions::ctype(this_00);
      }
      field._0_4_ = (int)field + 1;
    }
  }
  return;
}

Assistant:

void DynamicMessageFactory::DeleteDefaultOneofInstance(
    const Descriptor* type,
    const uint32 offsets[],
    const void* default_oneof_instance) {
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
        switch (field->options().ctype()) {
          default:
          case FieldOptions::STRING:
            break;
        }
      }
    }
  }
}